

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# no_field_presence_test.cc
# Opt level: O3

void __thiscall
google::protobuf::anon_unknown_0::
NoFieldPresenceSerializeTest_OneofPresence_Test<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::TestBody(NoFieldPresenceSerializeTest_OneofPresence_Test<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *output;
  ArenaStringPtr *this_00;
  pointer pcVar1;
  bool bVar2;
  Arena *arena;
  pointer *__ptr;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_01;
  char *in_R9;
  pointer *__ptr_1;
  char *pcVar3;
  pointer *__ptr_5;
  string_view data;
  string_view data_00;
  string_view data_01;
  string_view value;
  TestAllTypes message;
  AssertHelper local_318;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_310;
  AssertHelperData *local_308;
  undefined1 local_300 [8];
  AssertHelperData *local_2f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f0;
  AssertHelper local_2e0;
  undefined1 local_2d8 [688];
  
  proto2_nofieldpresence_unittest::TestAllTypes::TestAllTypes
            ((TestAllTypes *)local_2d8,(Arena *)0x0);
  if (local_2d8._680_4_ != 0x71) {
    proto2_nofieldpresence_unittest::TestAllTypes::clear_oneof_field((TestAllTypes *)local_2d8);
    local_2d8._680_4_ = 0x71;
    local_2d8._672_8_ = &protobuf::internal::fixed_address_empty_string;
  }
  this_00 = (ArenaStringPtr *)(local_2d8 + 0x2a0);
  arena = (Arena *)local_2d8._8_8_;
  if ((local_2d8._8_8_ & 1) != 0) {
    arena = *(Arena **)(local_2d8._8_8_ & 0xfffffffffffffffe);
  }
  pcVar3 = anon_var_dwarf_a22956 + 5;
  protobuf::internal::ArenaStringPtr::Set(this_00,(string_view)(ZEXT816(0x10f75f1) << 0x40),arena);
  output = &(this->
            super_NoFieldPresenceSerializeTest<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ).value_;
  bVar2 = MessageLite::SerializeToString((MessageLite *)local_2d8,output);
  local_310._M_head_impl._0_1_ = (internal)bVar2;
  local_308 = (AssertHelperData *)0x0;
  if (bVar2) {
    local_2e0.data_._0_4_ = 3;
    pcVar1 = (this->
             super_NoFieldPresenceSerializeTest<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ).value_._M_dataplus._M_p;
    local_300 = (undefined1  [8])&local_2f0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_300,pcVar1,
               pcVar1 + (this->
                        super_NoFieldPresenceSerializeTest<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ).value_._M_string_length);
    local_318.data_ = local_2f8;
    testing::internal::CmpHelperEQ<int,unsigned_long>
              ((internal *)&local_310,"3","this->GetOutput().size()",(int *)&local_2e0,
               (unsigned_long *)&local_318);
    if (local_300 != (undefined1  [8])&local_2f0) {
      operator_delete((void *)local_300,local_2f0._M_allocated_capacity + 1);
    }
    if (local_310._M_head_impl._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)local_300);
      if (local_308 != (AssertHelperData *)0x0) {
        pcVar3 = *(char **)local_308;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_318,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
                 ,0x4d7,pcVar3);
      testing::internal::AssertHelper::operator=(&local_318,(Message *)local_300);
      testing::internal::AssertHelper::~AssertHelper(&local_318);
      if (local_300 != (undefined1  [8])0x0) {
        (**(code **)(*(size_type *)local_300 + 8))();
      }
    }
    if (local_308 != (AssertHelperData *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_308,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_308);
    }
    local_318.data_._0_1_ = 0x8a;
    pcVar1 = (this->
             super_NoFieldPresenceSerializeTest<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ).value_._M_dataplus._M_p;
    local_300 = (undefined1  [8])&local_2f0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_300,pcVar1,
               pcVar1 + (this->
                        super_NoFieldPresenceSerializeTest<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ).value_._M_string_length);
    if (local_2f8 == (AssertHelperData *)0x0) {
      std::__throw_out_of_range_fmt
                ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",0,0);
    }
    testing::internal::CmpHelperEQ<char,char>
              ((internal *)&local_310,"static_cast<char>(0x8a)","this->GetOutput().at(0)",
               (char *)&local_318,(char *)local_300);
    if (local_300 != (undefined1  [8])&local_2f0) {
      operator_delete((void *)local_300,local_2f0._M_allocated_capacity + 1);
    }
    if (local_310._M_head_impl._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)local_300);
      if (local_308 == (AssertHelperData *)0x0) {
        pcVar3 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar3 = *(char **)local_308;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_318,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
                 ,0x4d8,pcVar3);
      testing::internal::AssertHelper::operator=(&local_318,(Message *)local_300);
      testing::internal::AssertHelper::~AssertHelper(&local_318);
      if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )local_300 !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(size_type *)local_300 + 8))();
      }
    }
    if (local_308 != (AssertHelperData *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_308,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_308);
    }
    local_318.data_._0_1_ = 7;
    pcVar1 = (this->
             super_NoFieldPresenceSerializeTest<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ).value_._M_dataplus._M_p;
    local_300 = (undefined1  [8])&local_2f0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_300,pcVar1,
               pcVar1 + (this->
                        super_NoFieldPresenceSerializeTest<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ).value_._M_string_length);
    if (local_2f8 < (AssertHelperData *)0x2) {
      std::__throw_out_of_range_fmt
                ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",1);
    }
    testing::internal::CmpHelperEQ<char,char>
              ((internal *)&local_310,"static_cast<char>(0x07)","this->GetOutput().at(1)",
               (char *)&local_318,(char *)((long)local_300 + 1));
    if (local_300 != (undefined1  [8])&local_2f0) {
      operator_delete((void *)local_300,local_2f0._M_allocated_capacity + 1);
    }
    if (local_310._M_head_impl._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)local_300);
      if (local_308 == (AssertHelperData *)0x0) {
        pcVar3 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar3 = *(char **)local_308;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_318,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
                 ,0x4d9,pcVar3);
      testing::internal::AssertHelper::operator=(&local_318,(Message *)local_300);
      testing::internal::AssertHelper::~AssertHelper(&local_318);
      if (local_300 != (undefined1  [8])0x0) {
        (**(code **)(*(size_type *)local_300 + 8))();
      }
    }
    if (local_308 != (AssertHelperData *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_308,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_308);
    }
    local_318.data_ = local_318.data_ & 0xffffffffffffff00;
    pcVar1 = (this->
             super_NoFieldPresenceSerializeTest<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ).value_._M_dataplus._M_p;
    local_300 = (undefined1  [8])&local_2f0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_300,pcVar1,
               pcVar1 + (this->
                        super_NoFieldPresenceSerializeTest<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ).value_._M_string_length);
    if (local_2f8 < (AssertHelperData *)0x3) {
      std::__throw_out_of_range_fmt
                ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",2);
    }
    testing::internal::CmpHelperEQ<char,char>
              ((internal *)&local_310,"static_cast<char>(0x00)","this->GetOutput().at(2)",
               (char *)&local_318,(char *)((long)local_300 + 2));
    if (local_300 != (undefined1  [8])&local_2f0) {
      operator_delete((void *)local_300,local_2f0._M_allocated_capacity + 1);
    }
    if (local_310._M_head_impl._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)local_300);
      if (local_308 == (AssertHelperData *)0x0) {
        pcVar3 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar3 = *(char **)local_308;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_318,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
                 ,0x4da,pcVar3);
      testing::internal::AssertHelper::operator=(&local_318,(Message *)local_300);
      testing::internal::AssertHelper::~AssertHelper(&local_318);
      if (local_300 != (undefined1  [8])0x0) {
        (**(code **)(*(size_type *)local_300 + 8))();
      }
    }
    if (local_308 != (AssertHelperData *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_308,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_308);
    }
    proto2_nofieldpresence_unittest::TestAllTypes::Clear((TestAllTypes *)local_2d8);
    pcVar1 = (this->
             super_NoFieldPresenceSerializeTest<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ).value_._M_dataplus._M_p;
    local_300 = (undefined1  [8])&local_2f0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_300,pcVar1,
               pcVar1 + (this->
                        super_NoFieldPresenceSerializeTest<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ).value_._M_string_length);
    data._M_str = (char *)local_300;
    data._M_len = (size_t)local_2f8;
    bVar2 = MessageLite::ParseFromString((MessageLite *)local_2d8,data);
    local_310._M_head_impl._0_1_ = (internal)bVar2;
    local_308 = (AssertHelperData *)0x0;
    if (local_300 == (undefined1  [8])&local_2f0) {
      if (!bVar2) goto LAB_008c4f69;
    }
    else {
      operator_delete((void *)local_300,local_2f0._M_allocated_capacity + 1);
      if (((ulong)local_310._M_head_impl & 1) == 0) {
LAB_008c4f69:
        testing::Message::Message((Message *)&local_318);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_300,(internal *)&local_310,
                   (AssertionResult *)"message.ParseFromString(this->GetOutput())","false","true",
                   in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_2e0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
                   ,0x4dd,(char *)local_300);
        testing::internal::AssertHelper::operator=(&local_2e0,(Message *)&local_318);
        testing::internal::AssertHelper::~AssertHelper(&local_2e0);
        if (local_300 != (undefined1  [8])&local_2f0) {
          operator_delete((void *)local_300,local_2f0._M_allocated_capacity + 1);
        }
        if (local_318.data_ != (AssertHelperData *)0x0) {
          (**(code **)(*(long *)local_318.data_ + 8))();
        }
      }
    }
    if (local_308 != (AssertHelperData *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_308,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_308);
    }
    local_310._M_head_impl._0_4_ = 0x71;
    local_318.data_._0_4_ = local_2d8._680_4_;
    testing::internal::
    CmpHelperEQ<proto2_nofieldpresence_unittest::TestAllTypes::OneofFieldCase,proto2_nofieldpresence_unittest::TestAllTypes::OneofFieldCase>
              ((internal *)local_300,"TestAllTypes::kOneofString","message.oneof_field_case()",
               (OneofFieldCase *)&local_310,(OneofFieldCase *)&local_318);
    if (local_300[0] == (string)0x0) {
      testing::Message::Message((Message *)&local_310);
      if (local_2f8 == (AssertHelperData *)0x0) {
        pcVar3 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar3 = *(char **)local_2f8;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_318,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
                 ,0x4de,pcVar3);
      testing::internal::AssertHelper::operator=(&local_318,(Message *)&local_310);
      testing::internal::AssertHelper::~AssertHelper(&local_318);
      if (local_310._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_310._M_head_impl + 8))();
      }
    }
    if (local_2f8 != (AssertHelperData *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_2f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f8);
    }
    proto2_nofieldpresence_unittest::TestAllTypes::Clear((TestAllTypes *)local_2d8);
    if (local_2d8._680_4_ != 0x6f) {
      proto2_nofieldpresence_unittest::TestAllTypes::clear_oneof_field((TestAllTypes *)local_2d8);
      local_2d8._680_4_ = 0x6f;
    }
    local_2d8._672_8_ = local_2d8._672_8_ & 0xffffffff00000000;
    bVar2 = MessageLite::SerializeToString((MessageLite *)local_2d8,output);
    local_310._M_head_impl._0_1_ = (internal)bVar2;
    local_308 = (AssertHelperData *)0x0;
    if (!bVar2) {
      testing::Message::Message((Message *)&local_318);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_300,(internal *)&local_310,
                 (AssertionResult *)"TestSerialize(message, &output_sink)","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_2e0,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
                 ,0x4e3,(char *)local_300);
      testing::internal::AssertHelper::operator=(&local_2e0,(Message *)&local_318);
LAB_008c552b:
      testing::internal::AssertHelper::~AssertHelper(&local_2e0);
      if (local_300 != (undefined1  [8])&local_2f0) goto LAB_008c4c97;
      goto LAB_008c4ca4;
    }
    local_2e0.data_._0_4_ = 3;
    pcVar1 = (this->
             super_NoFieldPresenceSerializeTest<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ).value_._M_dataplus._M_p;
    local_300 = (undefined1  [8])&local_2f0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_300,pcVar1,
               pcVar1 + (this->
                        super_NoFieldPresenceSerializeTest<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ).value_._M_string_length);
    local_318.data_ = local_2f8;
    testing::internal::CmpHelperEQ<int,unsigned_long>
              ((internal *)&local_310,"3","this->GetOutput().size()",(int *)&local_2e0,
               (unsigned_long *)&local_318);
    if (local_300 != (undefined1  [8])&local_2f0) {
      operator_delete((void *)local_300,local_2f0._M_allocated_capacity + 1);
    }
    if (local_310._M_head_impl._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)local_300);
      if (local_308 == (AssertHelperData *)0x0) {
        pcVar3 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar3 = *(char **)local_308;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_318,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
                 ,0x4e4,pcVar3);
      testing::internal::AssertHelper::operator=(&local_318,(Message *)local_300);
      testing::internal::AssertHelper::~AssertHelper(&local_318);
      if (local_300 != (undefined1  [8])0x0) {
        (**(code **)(*(size_type *)local_300 + 8))();
      }
    }
    if (local_308 != (AssertHelperData *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_308,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_308);
    }
    pcVar1 = (this->
             super_NoFieldPresenceSerializeTest<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ).value_._M_dataplus._M_p;
    local_300 = (undefined1  [8])&local_2f0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_300,pcVar1,
               pcVar1 + (this->
                        super_NoFieldPresenceSerializeTest<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ).value_._M_string_length);
    data_00._M_str = (char *)local_300;
    data_00._M_len = (size_t)local_2f8;
    bVar2 = MessageLite::ParseFromString((MessageLite *)local_2d8,data_00);
    local_310._M_head_impl._0_1_ = (internal)bVar2;
    local_308 = (AssertHelperData *)0x0;
    if (local_300 == (undefined1  [8])&local_2f0) {
      if (!bVar2) goto LAB_008c52aa;
    }
    else {
      operator_delete((void *)local_300,local_2f0._M_allocated_capacity + 1);
      if (((ulong)local_310._M_head_impl & 1) == 0) {
LAB_008c52aa:
        testing::Message::Message((Message *)&local_318);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_300,(internal *)&local_310,
                   (AssertionResult *)"message.ParseFromString(this->GetOutput())","false","true",
                   in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_2e0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
                   ,0x4e5,(char *)local_300);
        testing::internal::AssertHelper::operator=(&local_2e0,(Message *)&local_318);
        testing::internal::AssertHelper::~AssertHelper(&local_2e0);
        if (local_300 != (undefined1  [8])&local_2f0) {
          operator_delete((void *)local_300,local_2f0._M_allocated_capacity + 1);
        }
        if (local_318.data_ != (AssertHelperData *)0x0) {
          (**(code **)(*(long *)local_318.data_ + 8))();
        }
      }
    }
    if (local_308 != (AssertHelperData *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_308,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_308);
    }
    local_310._M_head_impl._0_4_ = 0x6f;
    local_318.data_._0_4_ = local_2d8._680_4_;
    testing::internal::
    CmpHelperEQ<proto2_nofieldpresence_unittest::TestAllTypes::OneofFieldCase,proto2_nofieldpresence_unittest::TestAllTypes::OneofFieldCase>
              ((internal *)local_300,"TestAllTypes::kOneofUint32","message.oneof_field_case()",
               (OneofFieldCase *)&local_310,(OneofFieldCase *)&local_318);
    if (local_300[0] == (string)0x0) {
      testing::Message::Message((Message *)&local_310);
      if (local_2f8 == (AssertHelperData *)0x0) {
        pcVar3 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar3 = *(char **)local_2f8;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_318,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
                 ,0x4e6,pcVar3);
      testing::internal::AssertHelper::operator=(&local_318,(Message *)&local_310);
      testing::internal::AssertHelper::~AssertHelper(&local_318);
      if (local_310._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_310._M_head_impl + 8))();
      }
    }
    if (local_2f8 != (AssertHelperData *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_2f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f8);
    }
    proto2_nofieldpresence_unittest::TestAllTypes::Clear((TestAllTypes *)local_2d8);
    if (local_2d8._680_4_ != 0x72) {
      proto2_nofieldpresence_unittest::TestAllTypes::clear_oneof_field((TestAllTypes *)local_2d8);
      local_2d8._680_4_ = 0x72;
    }
    local_2d8._672_8_ = local_2d8._672_8_ & 0xffffffff00000000;
    bVar2 = MessageLite::SerializeToString((MessageLite *)local_2d8,output);
    local_310._M_head_impl._0_1_ = (internal)bVar2;
    local_308 = (AssertHelperData *)0x0;
    if (!bVar2) {
      testing::Message::Message((Message *)&local_318);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_300,(internal *)&local_310,
                 (AssertionResult *)"TestSerialize(message, &output_sink)","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_2e0,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
                 ,0x4ea,(char *)local_300);
      testing::internal::AssertHelper::operator=(&local_2e0,(Message *)&local_318);
      goto LAB_008c552b;
    }
    local_2e0.data_._0_4_ = 3;
    pcVar1 = (this->
             super_NoFieldPresenceSerializeTest<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ).value_._M_dataplus._M_p;
    local_300 = (undefined1  [8])&local_2f0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_300,pcVar1,
               pcVar1 + (this->
                        super_NoFieldPresenceSerializeTest<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ).value_._M_string_length);
    local_318.data_ = local_2f8;
    testing::internal::CmpHelperEQ<int,unsigned_long>
              ((internal *)&local_310,"3","this->GetOutput().size()",(int *)&local_2e0,
               (unsigned_long *)&local_318);
    if (local_300 != (undefined1  [8])&local_2f0) {
      operator_delete((void *)local_300,local_2f0._M_allocated_capacity + 1);
    }
    if (local_310._M_head_impl._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)local_300);
      if (local_308 == (AssertHelperData *)0x0) {
        pcVar3 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar3 = *(char **)local_308;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_318,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
                 ,0x4eb,pcVar3);
      testing::internal::AssertHelper::operator=(&local_318,(Message *)local_300);
      testing::internal::AssertHelper::~AssertHelper(&local_318);
      if (local_300 != (undefined1  [8])0x0) {
        (**(code **)(*(size_type *)local_300 + 8))();
      }
    }
    if (local_308 != (AssertHelperData *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_308,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_308);
    }
    pcVar1 = (this->
             super_NoFieldPresenceSerializeTest<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ).value_._M_dataplus._M_p;
    local_300 = (undefined1  [8])&local_2f0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_300,pcVar1,
               pcVar1 + (this->
                        super_NoFieldPresenceSerializeTest<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ).value_._M_string_length);
    data_01._M_str = (char *)local_300;
    data_01._M_len = (size_t)local_2f8;
    bVar2 = MessageLite::ParseFromString((MessageLite *)local_2d8,data_01);
    local_310._M_head_impl._0_1_ = (internal)bVar2;
    local_308 = (AssertHelperData *)0x0;
    if (local_300 == (undefined1  [8])&local_2f0) {
      if (!bVar2) goto LAB_008c5608;
    }
    else {
      operator_delete((void *)local_300,local_2f0._M_allocated_capacity + 1);
      if (((ulong)local_310._M_head_impl & 1) == 0) {
LAB_008c5608:
        testing::Message::Message((Message *)&local_318);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_300,(internal *)&local_310,
                   (AssertionResult *)"message.ParseFromString(this->GetOutput())","false","true",
                   in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_2e0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
                   ,0x4ec,(char *)local_300);
        testing::internal::AssertHelper::operator=(&local_2e0,(Message *)&local_318);
        testing::internal::AssertHelper::~AssertHelper(&local_2e0);
        if (local_300 != (undefined1  [8])&local_2f0) {
          operator_delete((void *)local_300,local_2f0._M_allocated_capacity + 1);
        }
        if (local_318.data_ != (AssertHelperData *)0x0) {
          (**(code **)(*(long *)local_318.data_ + 8))();
        }
      }
    }
    if (local_308 != (AssertHelperData *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_308,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_308);
    }
    local_310._M_head_impl._0_4_ = 0x72;
    local_318.data_._0_4_ = local_2d8._680_4_;
    testing::internal::
    CmpHelperEQ<proto2_nofieldpresence_unittest::TestAllTypes::OneofFieldCase,proto2_nofieldpresence_unittest::TestAllTypes::OneofFieldCase>
              ((internal *)local_300,"TestAllTypes::kOneofEnum","message.oneof_field_case()",
               (OneofFieldCase *)&local_310,(OneofFieldCase *)&local_318);
    if (local_300[0] == (string)0x0) {
      testing::Message::Message((Message *)&local_310);
      if (local_2f8 == (AssertHelperData *)0x0) {
        pcVar3 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar3 = *(char **)local_2f8;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_318,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
                 ,0x4ed,pcVar3);
      testing::internal::AssertHelper::operator=(&local_318,(Message *)&local_310);
      testing::internal::AssertHelper::~AssertHelper(&local_318);
      if (local_310._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_310._M_head_impl + 8))();
      }
    }
    if (local_2f8 != (AssertHelperData *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_2f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f8);
    }
    proto2_nofieldpresence_unittest::TestAllTypes::Clear((TestAllTypes *)local_2d8);
    if (local_2d8._680_4_ != 0x71) {
      proto2_nofieldpresence_unittest::TestAllTypes::clear_oneof_field((TestAllTypes *)local_2d8);
      local_2d8._680_4_ = 0x71;
      local_2d8._672_8_ = &protobuf::internal::fixed_address_empty_string;
    }
    if ((local_2d8._8_8_ & 1) != 0) {
      local_2d8._8_8_ = *(undefined8 *)(local_2d8._8_8_ & 0xfffffffffffffffe);
    }
    value._M_str = "test";
    value._M_len = 4;
    protobuf::internal::ArenaStringPtr::Set(this_00,value,(Arena *)local_2d8._8_8_);
    if (local_2d8._680_4_ == 0x71) {
      protobuf::internal::ArenaStringPtr::Destroy(this_00);
      local_2d8._680_4_ = 0;
    }
    local_318.data_ = local_318.data_ & 0xffffffff00000000;
    local_310._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         proto2_nofieldpresence_unittest::TestAllTypes::ByteSizeLong((TestAllTypes *)local_2d8);
    testing::internal::CmpHelperEQ<int,unsigned_long>
              ((internal *)local_300,"0","message.ByteSizeLong()",(int *)&local_318,
               (unsigned_long *)&local_310);
    if (local_300[0] == (string)0x0) {
      testing::Message::Message((Message *)&local_310);
      if (local_2f8 == (AssertHelperData *)0x0) {
        pcVar3 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar3 = *(char **)local_2f8;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_318,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
                 ,0x4f2,pcVar3);
      testing::internal::AssertHelper::operator=(&local_318,(Message *)&local_310);
      testing::internal::AssertHelper::~AssertHelper(&local_318);
      if (local_310._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_310._M_head_impl + 8))();
      }
    }
    if (local_2f8 == (AssertHelperData *)0x0) goto LAB_008c4cc5;
    this_01 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_2f8;
  }
  else {
    testing::Message::Message((Message *)&local_318);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_300,(internal *)&local_310,
               (AssertionResult *)"TestSerialize(message, &output_sink)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_2e0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
               ,0x4d3,(char *)local_300);
    testing::internal::AssertHelper::operator=(&local_2e0,(Message *)&local_318);
    testing::internal::AssertHelper::~AssertHelper(&local_2e0);
    if (local_300 != (undefined1  [8])&local_2f0) {
LAB_008c4c97:
      operator_delete((void *)local_300,local_2f0._M_allocated_capacity + 1);
    }
LAB_008c4ca4:
    this_01 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_308;
    if (local_318.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_318.data_ + 8))();
    }
    local_2f8 = local_308;
    if (local_308 == (AssertHelperData *)0x0) goto LAB_008c4cc5;
  }
  std::
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()(this_01,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f8)
  ;
LAB_008c4cc5:
  proto2_nofieldpresence_unittest::TestAllTypes::~TestAllTypes((TestAllTypes *)local_2d8);
  return;
}

Assistant:

TYPED_TEST(NoFieldPresenceSerializeTest, OneofPresence) {
  TestAllTypes message;
  // oneof fields still have field presence -- ensure that this goes on the wire
  // even though its value is the empty string.
  message.set_oneof_string("");
  TypeParam& output_sink = this->GetOutputSinkRef();
  ASSERT_TRUE(TestSerialize(message, &output_sink));
  // Tag: 113 --> tag is (113 << 3) | 2 (length delimited) = 906
  // varint: 0x8a 0x07
  // Length: 0x00
  EXPECT_EQ(3, this->GetOutput().size());
  EXPECT_EQ(static_cast<char>(0x8a), this->GetOutput().at(0));
  EXPECT_EQ(static_cast<char>(0x07), this->GetOutput().at(1));
  EXPECT_EQ(static_cast<char>(0x00), this->GetOutput().at(2));

  message.Clear();
  EXPECT_TRUE(message.ParseFromString(this->GetOutput()));
  EXPECT_EQ(TestAllTypes::kOneofString, message.oneof_field_case());

  // Also test int32 and enum fields.
  message.Clear();
  message.set_oneof_uint32(0);  // would not go on wire if ordinary field.
  ASSERT_TRUE(TestSerialize(message, &output_sink));
  EXPECT_EQ(3, this->GetOutput().size());
  EXPECT_TRUE(message.ParseFromString(this->GetOutput()));
  EXPECT_EQ(TestAllTypes::kOneofUint32, message.oneof_field_case());

  message.Clear();
  message.set_oneof_enum(TestAllTypes::FOO);  // FOO is the default value.
  ASSERT_TRUE(TestSerialize(message, &output_sink));
  EXPECT_EQ(3, this->GetOutput().size());
  EXPECT_TRUE(message.ParseFromString(this->GetOutput()));
  EXPECT_EQ(TestAllTypes::kOneofEnum, message.oneof_field_case());

  message.Clear();
  message.set_oneof_string("test");
  message.clear_oneof_string();
  EXPECT_EQ(0, message.ByteSizeLong());
}